

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_read_word(p_ply_conflict ply)

{
  int iVar1;
  size_t sVar2;
  p_ply_conflict ptVar3;
  p_ply_conflict in_RDI;
  size_t t;
  
  while (sVar2 = strspn(in_RDI->buffer + in_RDI->buffer_first," \n\r\t"),
        in_RDI->buffer_last - in_RDI->buffer_first <= sVar2) {
    iVar1 = BREFILL(in_RDI);
    if (iVar1 == 0) {
      ply_ferror(in_RDI,"Unexpected end of file");
      return 0;
    }
  }
  in_RDI->buffer_first = sVar2 + in_RDI->buffer_first;
  ptVar3 = (p_ply_conflict)strcspn(in_RDI->buffer + in_RDI->buffer_first," \n\r\t");
  if (ptVar3 < (p_ply_conflict)(in_RDI->buffer_last - in_RDI->buffer_first)) {
    ply_finish_word(in_RDI,(size_t)ptVar3);
    iVar1 = ply_check_word(ptVar3);
    return iVar1;
  }
  iVar1 = BREFILL(in_RDI);
  if (iVar1 == 0) {
    ply_finish_word(in_RDI,(size_t)ptVar3);
    iVar1 = ply_check_word(ptVar3);
    return iVar1;
  }
  sVar2 = strcspn(in_RDI->buffer + in_RDI->buffer_first + (long)ptVar3," \n\r\t");
  ptVar3 = (p_ply_conflict)(ptVar3->buffer + (sVar2 - 0x48));
  if ((p_ply_conflict)(in_RDI->buffer_last - in_RDI->buffer_first) <= ptVar3) {
    ply_ferror(in_RDI,"Token too large");
    return 0;
  }
  ply_finish_word(in_RDI,(size_t)ptVar3);
  iVar1 = ply_check_word(ptVar3);
  return iVar1;
}

Assistant:

static int ply_read_word(p_ply ply) {
    size_t t = 0;
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    /* skip leading blanks */
    while (1) {
        t = strspn(BFIRST(ply), " \n\r\t");
        /* check if all buffer was made of blanks */
        if (t >= BSIZE(ply)) {
            if (!BREFILL(ply)) {
                ply_ferror(ply, "Unexpected end of file");
                return 0;
            }
        } else break;
    }
    BSKIP(ply, t);
    /* look for a space after the current word */
    t = strcspn(BFIRST(ply), " \n\r\t");
    /* if we didn't reach the end of the buffer, we are done */
    if (t < BSIZE(ply)) {
        ply_finish_word(ply, t);
        return ply_check_word(ply);
    }
    /* otherwise, try to refill buffer */
    if (!BREFILL(ply)) {
        /* if we reached the end of file, try to do with what we have */
        ply_finish_word(ply, t);
        return ply_check_word(ply);
        /* ply_ferror(ply, "Unexpected end of file"); */
        /* return 0; */
    }
    /* keep looking from where we left */
    t += strcspn(BFIRST(ply) + t, " \n\r\t");
    /* check if the token is too large for our buffer */
    if (t >= BSIZE(ply)) {
        ply_ferror(ply, "Token too large");
        return 0;
    }
    /* we are done */
    ply_finish_word(ply, t);
    return ply_check_word(ply);
}